

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall Matrix::Matrix(Matrix *this,int nx,int ny)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  int iVar4;
  int local_48;
  int local_44;
  int i;
  int ind;
  int upper;
  int lower;
  int right;
  int left;
  int center;
  int local_20;
  int local_1c;
  int nnz_est;
  int num_rows;
  int ny_local;
  int nx_local;
  Matrix *this_local;
  
  nnz_est = ny;
  num_rows = nx;
  _ny_local = this;
  std::vector<int,_std::allocator<int>_>::vector(&this->row_ptrs);
  std::vector<int,_std::allocator<int>_>::vector(&this->col_inds);
  std::vector<double,_std::allocator<double>_>::vector(&this->values);
  local_1c = num_rows * nnz_est;
  local_20 = local_1c * 5;
  std::vector<int,_std::allocator<int>_>::resize(&this->row_ptrs,(long)(local_1c + 1));
  std::vector<int,_std::allocator<int>_>::resize(&this->col_inds,(long)local_20);
  std::vector<double,_std::allocator<double>_>::resize(&this->values,(long)local_20);
  local_44 = 0;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->row_ptrs,0);
  *pvVar2 = 0;
  for (local_48 = 0; local_48 < local_1c; local_48 = local_48 + 1) {
    right = local_48;
    get_2d_neighbors(local_48,num_rows,nnz_est,&lower,&upper,&ind,&i);
    iVar1 = ind;
    if (ind != -1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->col_inds,(long)local_44);
      *pvVar2 = iVar1;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->values,(long)local_44);
      *pvVar3 = -1.0;
      local_44 = local_44 + 1;
    }
    iVar1 = lower;
    if (lower != -1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->col_inds,(long)local_44);
      *pvVar2 = iVar1;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->values,(long)local_44);
      *pvVar3 = -1.0;
      local_44 = local_44 + 1;
    }
    iVar1 = right;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->col_inds,(long)local_44);
    *pvVar2 = iVar1;
    iVar4 = local_44 + 1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->values,(long)local_44);
    iVar1 = upper;
    *pvVar3 = 4.0;
    if (upper != -1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->col_inds,(long)iVar4);
      *pvVar2 = iVar1;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->values,(long)iVar4);
      *pvVar3 = -1.0;
      iVar4 = local_44 + 2;
    }
    local_44 = iVar4;
    iVar1 = i;
    if (i != -1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->col_inds,(long)local_44);
      *pvVar2 = iVar1;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->values,(long)local_44);
      *pvVar3 = -1.0;
      local_44 = local_44 + 1;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->row_ptrs,(long)(local_48 + 1));
    *pvVar2 = local_44;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->col_inds,(long)local_44);
  std::vector<double,_std::allocator<double>_>::resize(&this->values,(long)local_44);
  return;
}

Assistant:

Matrix::Matrix(int nx, int ny) {
    int num_rows = nx*ny;
    int nnz_est  = 5*num_rows;

    row_ptrs.resize(num_rows+1);
    col_inds.resize(nnz_est);
    values  .resize(nnz_est);

    int center, left, right, lower, upper, ind = 0;

    row_ptrs[0] = 0;
    for (int i = 0; i < num_rows; i++) {
        center = i;

        get_2d_neighbors(center, nx, ny, left, right, lower, upper);

        if (lower != -1) { col_inds[ind] = lower; values[ind++] = -1; }
        if (left  != -1) { col_inds[ind] = left;  values[ind++] = -1; }

        col_inds[ind] = center; values[ind++] = 4;

        if (right != -1) { col_inds[ind] = right; values[ind++] = -1; }
        if (upper != -1) { col_inds[ind] = upper; values[ind++] = -1; }

        row_ptrs[i+1] = ind;
    }
    col_inds.resize(ind);
    values  .resize(ind);
}